

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

int __thiscall
icu_63::MeasureUnit::clone
          (MeasureUnit *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  MeasureUnit *this_00;
  undefined8 local_30;
  MeasureUnit *this_local;
  
  this_00 = (MeasureUnit *)UMemory::operator_new((UMemory *)0x18,(size_t)__fn);
  local_30 = (MeasureUnit *)0x0;
  if (this_00 != (MeasureUnit *)0x0) {
    MeasureUnit(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

UObject *MeasureUnit::clone() const {
    return new MeasureUnit(*this);
}